

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

void verify_files(char *msg)

{
  wchar_t wVar1;
  char *msg_local;
  
  failure("%s",msg);
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                   ,L'\x12',"file",L'Ƥ');
  failure("%s",msg);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                      ,L'\x14',"file",10);
  failure("%s",msg);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
             ,L'\x16',"file",L'\x02');
  failure("%s",msg);
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
             ,L'\x1a',"linkfile","file");
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
               ,L'\x1e',"symlink","file",L'\0');
  }
  failure("%s",msg);
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                   ,L'\"',"file2",L'ǿ');
  failure("%s",msg);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                      ,L'$',"file2",10);
  failure("%s",msg);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
             ,L'&',"file2",L'\x01');
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                   ,L')',"dir",L'ǽ');
  return;
}

Assistant:

static void
verify_files(const char *msg)
{
	/*
	 * Verify unpacked files.
	 */

	/* Regular file with 2 links. */
	failure("%s", msg);
	assertIsReg("file", 0644);
	failure("%s", msg);
	assertFileSize("file", 10);
	failure("%s", msg);
	assertFileNLinks("file", 2);

	/* Another name for the same file. */
	failure("%s", msg);
	assertIsHardlink("linkfile", "file");

	/* Symlink */
	if (canSymlink())
		assertIsSymlink("symlink", "file", 0);

	/* Another file with 1 link and different permissions. */
	failure("%s", msg);
	assertIsReg("file2", 0777);
	failure("%s", msg);
	assertFileSize("file2", 10);
	failure("%s", msg);
	assertFileNLinks("file2", 1);

	/* dir */
	assertIsDir("dir", 0775);
}